

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

double wabt::interp::FloatDiv<double>(double lhs,double rhs)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  undefined8 local_30;
  undefined8 local_28;
  double rhs_local;
  double lhs_local;
  
  if (rhs == 0.0) {
    uVar3 = std::isnan(lhs);
    if (((uVar3 & 1) == 0) && ((lhs != 0.0 || (NAN(lhs))))) {
      bVar1 = std::signbit(lhs);
      bVar2 = std::signbit(rhs);
      dVar4 = std::numeric_limits<double>::infinity();
      dVar5 = std::numeric_limits<double>::infinity();
      local_30 = -dVar4;
      if (bVar1 == bVar2) {
        local_30 = dVar5;
      }
      local_28 = local_30;
    }
    else {
      local_28 = std::numeric_limits<double>::quiet_NaN();
    }
    lhs_local = local_28;
  }
  else {
    lhs_local = CanonNaN<double,_0>(lhs / rhs);
  }
  return lhs_local;
}

Assistant:

T WABT_VECTORCALL FloatDiv(T lhs, T rhs) {
  // IEE754 specifies what should happen when dividing a float by zero, but
  // C/C++ says it is undefined behavior.
  if (WABT_UNLIKELY(rhs == 0)) {
    return std::isnan(lhs) || lhs == 0
               ? std::numeric_limits<T>::quiet_NaN()
               : ((std::signbit(lhs) ^ std::signbit(rhs))
                      ? -std::numeric_limits<T>::infinity()
                      : std::numeric_limits<T>::infinity());
  }
  return CanonNaN(lhs / rhs);
}